

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

UBool __thiscall icu_63::UCharsTrieBuilder::ensureCapacity(UCharsTrieBuilder *this,int32_t length)

{
  int32_t iVar1;
  char16_t *pcVar2;
  UChar *newUChars;
  int32_t newCapacity;
  int32_t length_local;
  UCharsTrieBuilder *this_local;
  
  if (this->uchars == (char16_t *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    if (this->ucharsCapacity < length) {
      iVar1 = this->ucharsCapacity;
      do {
        newUChars._0_4_ = iVar1;
        iVar1 = (int)newUChars * 2;
      } while (iVar1 <= length);
      pcVar2 = (char16_t *)uprv_malloc_63((long)((int)newUChars << 2));
      if (pcVar2 == (char16_t *)0x0) {
        uprv_free_63(this->uchars);
        this->uchars = (char16_t *)0x0;
        this->ucharsCapacity = 0;
        return '\0';
      }
      u_memcpy_63(pcVar2 + (iVar1 - this->ucharsLength),
                  this->uchars + (this->ucharsCapacity - this->ucharsLength),this->ucharsLength);
      uprv_free_63(this->uchars);
      this->uchars = pcVar2;
      this->ucharsCapacity = iVar1;
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
UCharsTrieBuilder::ensureCapacity(int32_t length) {
    if(uchars==NULL) {
        return FALSE;  // previous memory allocation had failed
    }
    if(length>ucharsCapacity) {
        int32_t newCapacity=ucharsCapacity;
        do {
            newCapacity*=2;
        } while(newCapacity<=length);
        UChar *newUChars=static_cast<UChar *>(uprv_malloc(newCapacity*2));
        if(newUChars==NULL) {
            // unable to allocate memory
            uprv_free(uchars);
            uchars=NULL;
            ucharsCapacity=0;
            return FALSE;
        }
        u_memcpy(newUChars+(newCapacity-ucharsLength),
                 uchars+(ucharsCapacity-ucharsLength), ucharsLength);
        uprv_free(uchars);
        uchars=newUChars;
        ucharsCapacity=newCapacity;
    }
    return TRUE;
}